

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O2

void test_bin_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  FitsKey *pFVar1;
  double dVar2;
  FitsHdu *pFVar3;
  int iVar4;
  ushort **ppuVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  FitsKey **ppFVar14;
  uint uVar15;
  int n;
  int local_c0;
  uint local_bc;
  int k;
  int status;
  FitsHdu *local_b0;
  FitsKey **local_a8;
  int datatype;
  fitsfile *local_98;
  int ntdim;
  long tdim [10];
  
  status = 0;
  ppFVar14 = hduptr->kwds;
  local_bc = hduptr->ncols;
  iVar4 = hduptr->tkeys;
  local_98 = infits;
  test_ext(infits,out,hduptr);
  local_b0 = hduptr;
  test_tbl(infits,out,hduptr);
  builtin_strncpy(temp,"TNULL",6);
  ptemp = temp;
  local_c0 = iVar4;
  key_match(tmpkwds,iVar4,&ptemp,0,&k,&n);
  lVar11 = (long)k;
  lVar12 = n + lVar11;
  for (; lVar11 < lVar12; lVar11 = lVar11 + 1) {
    pFVar1 = ppFVar14[lVar11];
    ppuVar5 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar5 + (long)pFVar1->kname[5] * 2 + 1) & 8) != 0) {
      check_int(pFVar1,out);
      uVar6 = strtol(pFVar1->kname + 5,(char **)0x0,10);
      iVar4 = (int)uVar6;
      if ((int)local_bc < iVar4 || iVar4 < 1) {
        sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                (ulong)(uint)ppFVar14[lVar11]->kindex,ppFVar14[lVar11],uVar6 & 0xffffffff);
        wrterr(out,errmes,1);
      }
      else {
        uVar15 = iVar4 - 1;
        pcVar8 = tform[uVar15];
        pcVar7 = strchr(pcVar8,0x42);
        if ((((pcVar7 == (char *)0x0) && (pcVar7 = strchr(pcVar8,0x49), pcVar7 == (char *)0x0)) &&
            (pcVar7 = strchr(pcVar8,0x4a), pcVar7 == (char *)0x0)) &&
           (pcVar7 = strchr(pcVar8,0x4b), pcVar7 == (char *)0x0)) {
          sprintf(errmes,"Keyword #%d, %s is used for the column with format \"%s \".",
                  (ulong)(uint)ppFVar14[lVar11]->kindex,ppFVar14[lVar11],pcVar8);
          wrterr(out,errmes,2);
        }
        uVar6 = strtol(ppFVar14[lVar11]->kvalue,(char **)0x0,10);
        pcVar8 = strchr(tform[uVar15],0x42);
        if ((pcVar8 != (char *)0x0) && (0xff < uVar6)) {
          sprintf(errmes,"Keyword #%d, %s: The value %ld",(ulong)(uint)ppFVar14[lVar11]->kindex,
                  ppFVar14[lVar11],uVar6);
          sVar9 = strlen(errmes);
          builtin_strncpy(errmes + sVar9," is not ",8);
          builtin_strncpy(errmes + sVar9 + 8,"in the r",8);
          builtin_strncpy(errmes + sVar9 + 0x10,"ange of ",8);
          builtin_strncpy(errmes + sVar9 + 0x18,"datatype",8);
          builtin_strncpy(errmes + sVar9 + 0x20," B.",4);
          wrtwrn(out,errmes,0);
        }
        lVar10 = strtol(ppFVar14[lVar11]->kvalue,(char **)0x0,10);
        pcVar8 = strchr(tform[uVar15],0x49);
        if ((pcVar8 != (char *)0x0) && (lVar10 - 0x8000U < 0xffffffffffff0000)) {
          sprintf(errmes,"Keyword #%d, %s: The value %ld",(ulong)(uint)ppFVar14[lVar11]->kindex,
                  ppFVar14[lVar11],lVar10);
          sVar9 = strlen(errmes);
          builtin_strncpy(errmes + sVar9," is not ",8);
          builtin_strncpy(errmes + sVar9 + 8,"in the r",8);
          builtin_strncpy(errmes + sVar9 + 0x10,"ange of ",8);
          builtin_strncpy(errmes + sVar9 + 0x18,"datatype",8);
          builtin_strncpy(errmes + sVar9 + 0x20," I ",4);
          wrtwrn(out,errmes,0);
        }
      }
    }
  }
  builtin_strncpy(temp,"TSCAL",6);
  ptemp = temp;
  key_match(tmpkwds,local_c0,&ptemp,0,&k,&n);
  lVar12 = (long)k;
  lVar11 = n + lVar12;
  for (; lVar12 < lVar11; lVar12 = lVar12 + 1) {
    pFVar1 = ppFVar14[lVar12];
    ppuVar5 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar5 + (long)pFVar1->kname[5] * 2 + 1) & 8) != 0) {
      iVar4 = check_flt(pFVar1,out);
      if (iVar4 != 0) {
        dVar2 = strtod(ppFVar14[lVar12]->kvalue,(char **)0x0);
        if ((dVar2 == 0.0) && (!NAN(dVar2))) {
          sprintf(errmes,"Keyword #%d, %s:",(ulong)(uint)ppFVar14[lVar12]->kindex);
          sVar9 = strlen(errmes);
          builtin_strncpy(errmes + sVar9,"The scal",8);
          builtin_strncpy(errmes + sVar9 + 8,"ing fact",8);
          builtin_strncpy(errmes + sVar9 + 0xc,"factor i",8);
          builtin_strncpy(errmes + sVar9 + 0x14,"s zero.",8);
          wrtwrn(out,errmes,0);
        }
      }
      uVar6 = strtol(pFVar1->kname + 5,(char **)0x0,10);
      iVar4 = (int)uVar6;
      if ((int)local_bc < iVar4 || iVar4 < 1) {
        sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                (ulong)(uint)ppFVar14[lVar12]->kindex,ppFVar14[lVar12],uVar6 & 0xffffffff);
      }
      else {
        pcVar8 = tform[iVar4 - 1];
        pcVar7 = strchr(pcVar8,0x41);
        if (((pcVar7 == (char *)0x0) && (pcVar7 = strchr(pcVar8,0x4c), pcVar7 == (char *)0x0)) &&
           (pcVar8 = strchr(pcVar8,0x58), pcVar8 == (char *)0x0)) goto LAB_00109e5f;
        sprintf(errmes,"Keyword #%d, %s is used in A, L, or X column. ",
                (ulong)(uint)ppFVar14[lVar12]->kindex);
      }
      wrterr(out,errmes,1);
    }
LAB_00109e5f:
  }
  builtin_strncpy(temp,"TZERO",6);
  ptemp = temp;
  key_match(tmpkwds,local_c0,&ptemp,0,&k,&n);
  lVar11 = (long)k;
  lVar12 = n + lVar11;
  for (; pFVar3 = local_b0, lVar11 < lVar12; lVar11 = lVar11 + 1) {
    pFVar1 = ppFVar14[lVar11];
    ppuVar5 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar5 + (long)pFVar1->kname[5] * 2 + 1) & 8) != 0) {
      check_flt(pFVar1,out);
      uVar6 = strtol(pFVar1->kname + 5,(char **)0x0,10);
      iVar4 = (int)uVar6;
      if ((int)local_bc < iVar4 || iVar4 < 1) {
        sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                (ulong)(uint)ppFVar14[lVar11]->kindex,ppFVar14[lVar11],uVar6 & 0xffffffff);
      }
      else {
        pcVar8 = tform[iVar4 - 1];
        pcVar7 = strchr(pcVar8,0x41);
        if (((pcVar7 == (char *)0x0) || (pcVar7 = strchr(pcVar8,0x4c), pcVar7 == (char *)0x0)) ||
           (pcVar8 = strchr(pcVar8,0x58), pcVar8 == (char *)0x0)) goto LAB_00109fb9;
        sprintf(errmes,"Keyword #%d, %s is used in A, L, or X column. ",
                (ulong)(uint)ppFVar14[lVar11]->kindex);
      }
      wrterr(out,errmes,1);
    }
LAB_00109fb9:
  }
  local_b0->heap = (int)local_b0->naxes[1] * (int)*local_b0->naxes;
  builtin_strncpy(temp,"THEAP",6);
  key_match(tmpkwds,local_c0,&ptemp,1,&k,&n);
  lVar11 = (long)k;
  if (-1 < lVar11) {
    iVar4 = check_int(ppFVar14[lVar11],out);
    if (iVar4 != 0) {
      lVar12 = strtol(pFVar3->kwds[lVar11]->kvalue,(char **)0x0,10);
      pFVar3->heap = (int)lVar12;
    }
    if (pFVar3->pcount == 0) {
      sprintf(errmes,"Pcount is zero, but keyword THEAP is present at record #%d). ",
              (ulong)(uint)ppFVar14[lVar11]->kindex);
      wrterr(out,errmes,1);
    }
  }
  if (pFVar3->pcount != 0) {
    uVar15 = 0;
    if (0 < (int)local_bc) {
      uVar15 = local_bc;
    }
    uVar13 = 0;
    do {
      if (uVar15 == uVar13) {
        sprintf(errmes,"PCOUNT = %ld, but there are no variable-length array columns.",
                local_b0->pcount);
        wrtwrn(out,errmes,0);
        break;
      }
      iVar4 = ffgtcl(local_98,uVar13 + 1,&datatype,0,0,&status);
      if (iVar4 != 0) {
        sprintf(errmes,"Column #%d: ",(ulong)uVar13);
        wrtferr(out,errmes,&status,2);
      }
      uVar13 = uVar13 + 1;
    } while (-1 < datatype);
  }
  temp._4_2_ = temp._4_2_ & 0xff00;
  builtin_strncpy(temp,"TDIM",4);
  key_match(tmpkwds,local_c0,&ptemp,0,&k,&n);
  lVar11 = (long)k;
  lVar12 = n + lVar11;
  local_a8 = ppFVar14;
  do {
    if (lVar12 <= lVar11) {
      for (lVar11 = 0; lVar11 < local_b0->ncols; lVar11 = lVar11 + 1) {
        pcVar8 = tform[lVar11];
        pcVar7 = strchr(pcVar8,0x41);
        if (pcVar7 != (char *)0x0) {
          uVar6 = strtol(pcVar8,(char **)0x0,10);
          ppuVar5 = __ctype_b_loc();
          if (((*(byte *)((long)*ppuVar5 + (long)pcVar7[1] * 2 + 1) & 8) != 0) &&
             (lVar12 = strtol(pcVar7 + 1,(char **)0x0,10),
             (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                  (long)(int)lVar12) != 0)) {
            sprintf(errmes,"TFORM %s of column %d: repeat %d is not the multiple of the width %d",
                    tform[lVar11],(ulong)((int)lVar11 + 1),uVar6 & 0xffffffff);
            wrtwrn(out,errmes,0);
          }
        }
      }
      builtin_strncpy(temp,"TBCOL",6);
      ptemp = temp;
      key_match(tmpkwds,local_c0,&ptemp,0,&k,&n);
      lVar11 = (long)k;
      if (-1 < lVar11) {
        for (; (int)lVar11 < n + k; lVar11 = lVar11 + 1) {
          pFVar1 = ppFVar14[lVar11];
          sVar9 = strlen(temp);
          ppuVar5 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar5 + (long)pFVar1->kname[sVar9] * 2 + 1) & 8) != 0) {
            sprintf(errmes,"Keyword #%d, %s is not allowed in the Binary table.",
                    (ulong)(uint)local_b0->kwds[lVar11]->kindex);
            wrterr(out,errmes,1);
          }
        }
      }
      test_colnam(out,local_b0);
      return;
    }
    pFVar1 = ppFVar14[lVar11];
    ppuVar5 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar5 + (long)pFVar1->kname[4] * 2 + 1) & 8) != 0) {
      check_str(pFVar1,out);
      if (pFVar1->kvalue[0] == ' ') {
        sprintf(errmes,"Keyword #%d, %s: TDIM=\"%s\" ",(ulong)(uint)pFVar1->kindex,pFVar1,
                pFVar1->kvalue);
        sVar9 = strlen(errmes);
        builtin_strncpy(errmes + sVar9,"should n",8);
        builtin_strncpy(errmes + sVar9 + 8,"ot have ",8);
        builtin_strncpy(errmes + sVar9 + 0xf," leading",8);
        builtin_strncpy(errmes + sVar9 + 0x17," space.",8);
      }
      else {
        uVar6 = strtol(pFVar1->kname + 4,(char **)0x0,10);
        if ((int)uVar6 <= (int)local_bc && 0 < (int)uVar6) {
          iVar4 = ffdtdm(local_98,pFVar1->kvalue,uVar6 & 0xffffffff,10,&ntdim,tdim,&status);
          if (iVar4 != 0) {
            sprintf(errmes,"Keyword #%d, %s: ",(ulong)(uint)ppFVar14[lVar11]->kindex);
            ppFVar14 = local_a8;
            wrtferr(out,errmes,&status,1);
          }
          goto LAB_0010a270;
        }
        sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                (ulong)(uint)ppFVar14[lVar11]->kindex,ppFVar14[lVar11],uVar6 & 0xffffffff);
      }
      ppFVar14 = local_a8;
      wrterr(out,errmes,1);
    }
LAB_0010a270:
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void test_bin_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            )
{
    FitsKey *pkey;
    int i,j,k,n;
    long l;
    int status = 0;
    char *p;

    int ntdim;
    long tdim[10];
    int repeat, width;
    FitsKey **kwds;
    int numusrkey;
    int mcol, vla, datatype;

    /* The indexed keywords excluded from ascii table */
    char *exlkeys[] = { "TBCOL"}; 
    int nexlkeys = 1;

    kwds = hduptr->kwds;
    numusrkey = hduptr->tkeys;
    mcol = hduptr->ncols;

    /* General extension */ 
    test_ext(infits,out,hduptr);

    /* General table */ 
    test_tbl(infits,out,hduptr);

    /* The XTENSION, BITPIX, NAXIS, NAXISn, TFIELDS, PCOUNT, GCOUNT, TFORMn,  
       TTYPEn keywords  have been checked in CFITSIO */
    
    /*  Check TNULLn keywords */ 
    strcpy(temp,"TNULL");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	check_int(kwds[j],out);
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
           kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'B') == NULL &&  
           strchr(tform[i],'I') == NULL &&  
           strchr(tform[i],'J') == NULL &&  
           strchr(tform[i],'K') == NULL ) { 
            sprintf(errmes,
     "Keyword #%d, %s is used for the column with format \"%s \".", 
            kwds[j]->kindex,kwds[j]->kname,tform[i]); 
            wrterr(out,errmes,2); 
        } 
        l = strtol(kwds[j]->kvalue,NULL,10); 
        if(strchr(tform[i],'B') != NULL && (
            l < 0 || l > 255) ) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld", 
            kwds[j]->kindex,kwds[j]->kname, l); 
            strcat(errmes, " is not in the range of datatype B.");
            wrtwrn(out,errmes,0); 
        }
        l = strtol(kwds[j]->kvalue,NULL,10); 
        if(strchr(tform[i],'I') != NULL && (
            l < -32768 || l > 32767) ) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld", 
            kwds[j]->kindex,kwds[j]->kname, l); 
            strcat(errmes, " is not in the range of datatype I ");
            wrtwrn(out,errmes,0); 
        }
    } 
    
    /*  Check TSCALn keywords */ 
    strcpy(temp,"TSCAL");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	if (check_flt(kwds[j],out) && strtod(kwds[j]->kvalue,NULL) == 0.0) { 
            sprintf(errmes,"Keyword #%d, %s:",
            kwds[j]->kindex,kwds[j]->kname);
            strcat(errmes,
              "The scaling factor is zero.");
            wrtwrn(out,errmes,0); 
        }
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'A') != NULL ||  
           strchr(tform[i],'L') != NULL ||  
           strchr(tform[i],'X') != NULL ) { 
            sprintf(errmes,
         "Keyword #%d, %s is used in A, L, or X column. ",
            kwds[j]->kindex,kwds[j]->kname); 
            wrterr(out,errmes,1); 
        }
    } 

    /*  Check TZEROn keywords */ 
    strcpy(temp,"TZERO");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	check_flt(kwds[j],out);
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'A') != NULL &&  
           strchr(tform[i],'L') != NULL &&  
           strchr(tform[i],'X') != NULL ) { 
            sprintf(errmes,
                "Keyword #%d, %s is used in A, L, or X column. ",
            kwds[j]->kindex,kwds[j]->kname); 
            wrterr(out,errmes,1); 
        }
    } 

    /* Check THEAP keyword */   
    hduptr->heap = (hduptr->naxes[0]) * (hduptr->naxes[1]);
    strcpy(temp,"THEAP");
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n);  
    if(k > -1) { 
         if(check_int(kwds[k],out))
             hduptr->heap = (int) strtol(hduptr->kwds[k]->kvalue,NULL,10);
         if(!hduptr->pcount) { 
            sprintf( errmes, 
               "Pcount is zero, but keyword THEAP is present at record #%d). ",
	        kwds[k]->kindex);
                wrterr(out,errmes,1); 
         }
    }

    /* if PCOUNT != 0, test that there is at least 1 variable length array column */
    vla = 0;
    if(hduptr->pcount) {
        for (i=0; i< mcol; i++){ 
            if(fits_get_coltype(infits, i+1, &datatype, NULL, NULL, &status)){ 
               sprintf(errmes,"Column #%d: ",i);
 	       wrtferr(out,errmes, &status,2);
            }
            if (datatype < 0) {
	      vla = 1;
	      break;
	    }
	}

	if (vla == 0) {
	    sprintf(errmes,
	    "PCOUNT = %ld, but there are no variable-length array columns.",
	   (long) hduptr->pcount);
            wrtwrn(out,errmes,0);
	} 
    }
      
   
    /* Check TDIMn  keywords */ 
    strcpy(temp,"TDIM");
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
        pkey = kwds[j]; 
	p = pkey->kname; 
	p += 4;
        if(!isdigit((int)*p)) continue;
	check_str(kwds[j],out);
        if(*(pkey->kvalue) == ' ') { 
            sprintf(errmes,"Keyword #%d, %s: TDIM=\"%s\" ", 
                pkey->kindex,pkey->kname,pkey->kvalue); 
            strcat(errmes,
                    "should not have leading space.");
            wrterr(out,errmes,1); 
            continue;
        }
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
	if(fits_decode_tdim(infits,pkey->kvalue,i+1,10,&ntdim,tdim, &status)){ 
           sprintf(errmes,"Keyword #%d, %s: ", 
                kwds[j]->kindex,kwds[j]->kname);
	    wrtferr(out,errmes,&status,1);
        } 
    } 

    /* check the local convension "rAw"*/
    for (i = 0; i < hduptr->ncols; i++) { 
	if((p = strchr(tform[i],'A'))==NULL) continue; 
        repeat = (int) strtol(tform[i],NULL,10);
        p++;
	if(!isdigit((int)*p))continue;
	width = (int)strtol(p,NULL,10);
	if(repeat%width != 0)  { 
	    sprintf(errmes,
	 "TFORM %s of column %d: repeat %d is not the multiple of the width %d",
	    tform[i], i+1, repeat, width);
            wrtwrn(out,errmes,0);
        } 
    }
   
    for (i = 0; i < nexlkeys; i++) {
        strcpy(temp,exlkeys[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
        if(k < 0) continue;
        for (j = k; j < k+n; j++) { 
            pkey = hduptr->kwds[j];

	    p = kwds[j]->kname; 
	    p += strlen(temp);
            if(!isdigit((int)*p)) continue;

            sprintf( errmes, 
               "Keyword #%d, %s is not allowed in the Binary table.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
        } 
    }
    
    /* check whether the column name is unique */
    test_colnam(out, hduptr);
    return ;
}